

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintSExpression::maybePrintImplicitBlock(PrintSExpression *this,Expression *curr)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  Expression *pEVar2;
  Expression **ppEVar3;
  undefined1 local_38 [8];
  Iterator __begin2;
  
  pEVar2 = (Expression *)0x0;
  if (curr->_id == BlockId) {
    pEVar2 = curr;
  }
  if (((pEVar2 != (Expression *)0x0) && (this->full == false)) && (pEVar2[1].type.id == 0)) {
    __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar1 = (ArenaVector<wasm::Expression_*> *)pEVar2[2].type.id;
    local_38 = (undefined1  [8])(pEVar2 + 2);
    while ((__begin2.parent != pAVar1 || (local_38 != (undefined1  [8])(pEVar2 + 2)))) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_38);
      printFullLine(this,*ppEVar3);
      __begin2.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin2.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    return;
  }
  printFullLine(this,curr);
  return;
}

Assistant:

void PrintSExpression::maybePrintImplicitBlock(Expression* curr) {
  auto block = curr->dynCast<Block>();
  if (!full && block && block->name.isNull()) {
    for (auto expression : block->list) {
      printFullLine(expression);
    }
  } else {
    printFullLine(curr);
  }
}